

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O2

Promise<void> __thiscall
kj::anon_unknown_0::DatagramPortImpl::ReceiverImpl::receive(ReceiverImpl *this)

{
  NullableValue<kj::OwnFd> NVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  SourceLocation location;
  DatagramReceiver DVar5;
  char cVar6;
  int osErrorNumber;
  ssize_t sVar7;
  void *pvVar8;
  cmsghdr *__cmsg;
  long in_RSI;
  byte *pos;
  SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_unix_c__:1868:55)>
  *location_00;
  undefined1 local_150 [8];
  Fault f;
  anon_class_8_1_8991fb9c_for_func local_128;
  OwnPromiseNode intermediate;
  void *continuationTracePtr;
  DatagramReceiver local_110;
  msghdr local_108;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_d0;
  iovec iov;
  sockaddr_storage addr;
  
  local_108.msg_flags = 0;
  local_108._52_4_ = 0;
  local_108.msg_name = &addr;
  addr.__ss_padding[0x6e] = '\0';
  addr.__ss_padding[0x6f] = '\0';
  addr.__ss_padding[0x70] = '\0';
  addr.__ss_padding[0x71] = '\0';
  addr.__ss_padding[0x72] = '\0';
  addr.__ss_padding[0x73] = '\0';
  addr.__ss_padding[0x74] = '\0';
  addr.__ss_padding[0x75] = '\0';
  addr.__ss_align = 0;
  addr.__ss_padding[0x5e] = '\0';
  addr.__ss_padding[0x5f] = '\0';
  addr.__ss_padding[0x60] = '\0';
  addr.__ss_padding[0x61] = '\0';
  addr.__ss_padding[0x62] = '\0';
  addr.__ss_padding[99] = '\0';
  addr.__ss_padding[100] = '\0';
  addr.__ss_padding[0x65] = '\0';
  addr.__ss_padding[0x66] = '\0';
  addr.__ss_padding[0x67] = '\0';
  addr.__ss_padding[0x68] = '\0';
  addr.__ss_padding[0x69] = '\0';
  addr.__ss_padding[0x6a] = '\0';
  addr.__ss_padding[0x6b] = '\0';
  addr.__ss_padding[0x6c] = '\0';
  addr.__ss_padding[0x6d] = '\0';
  addr.__ss_padding[0x4e] = '\0';
  addr.__ss_padding[0x4f] = '\0';
  addr.__ss_padding[0x50] = '\0';
  addr.__ss_padding[0x51] = '\0';
  addr.__ss_padding[0x52] = '\0';
  addr.__ss_padding[0x53] = '\0';
  addr.__ss_padding[0x54] = '\0';
  addr.__ss_padding[0x55] = '\0';
  addr.__ss_padding[0x56] = '\0';
  addr.__ss_padding[0x57] = '\0';
  addr.__ss_padding[0x58] = '\0';
  addr.__ss_padding[0x59] = '\0';
  addr.__ss_padding[0x5a] = '\0';
  addr.__ss_padding[0x5b] = '\0';
  addr.__ss_padding[0x5c] = '\0';
  addr.__ss_padding[0x5d] = '\0';
  addr.__ss_padding[0x3e] = '\0';
  addr.__ss_padding[0x3f] = '\0';
  addr.__ss_padding[0x40] = '\0';
  addr.__ss_padding[0x41] = '\0';
  addr.__ss_padding[0x42] = '\0';
  addr.__ss_padding[0x43] = '\0';
  addr.__ss_padding[0x44] = '\0';
  addr.__ss_padding[0x45] = '\0';
  addr.__ss_padding[0x46] = '\0';
  addr.__ss_padding[0x47] = '\0';
  addr.__ss_padding[0x48] = '\0';
  addr.__ss_padding[0x49] = '\0';
  addr.__ss_padding[0x4a] = '\0';
  addr.__ss_padding[0x4b] = '\0';
  addr.__ss_padding[0x4c] = '\0';
  addr.__ss_padding[0x4d] = '\0';
  addr.__ss_padding[0x2e] = '\0';
  addr.__ss_padding[0x2f] = '\0';
  addr.__ss_padding[0x30] = '\0';
  addr.__ss_padding[0x31] = '\0';
  addr.__ss_padding[0x32] = '\0';
  addr.__ss_padding[0x33] = '\0';
  addr.__ss_padding[0x34] = '\0';
  addr.__ss_padding[0x35] = '\0';
  addr.__ss_padding[0x36] = '\0';
  addr.__ss_padding[0x37] = '\0';
  addr.__ss_padding[0x38] = '\0';
  addr.__ss_padding[0x39] = '\0';
  addr.__ss_padding[0x3a] = '\0';
  addr.__ss_padding[0x3b] = '\0';
  addr.__ss_padding[0x3c] = '\0';
  addr.__ss_padding[0x3d] = '\0';
  addr.__ss_padding[0x1e] = '\0';
  addr.__ss_padding[0x1f] = '\0';
  addr.__ss_padding[0x20] = '\0';
  addr.__ss_padding[0x21] = '\0';
  addr.__ss_padding[0x22] = '\0';
  addr.__ss_padding[0x23] = '\0';
  addr.__ss_padding[0x24] = '\0';
  addr.__ss_padding[0x25] = '\0';
  addr.__ss_padding[0x26] = '\0';
  addr.__ss_padding[0x27] = '\0';
  addr.__ss_padding[0x28] = '\0';
  addr.__ss_padding[0x29] = '\0';
  addr.__ss_padding[0x2a] = '\0';
  addr.__ss_padding[0x2b] = '\0';
  addr.__ss_padding[0x2c] = '\0';
  addr.__ss_padding[0x2d] = '\0';
  addr.__ss_padding[0xe] = '\0';
  addr.__ss_padding[0xf] = '\0';
  addr.__ss_padding[0x10] = '\0';
  addr.__ss_padding[0x11] = '\0';
  addr.__ss_padding[0x12] = '\0';
  addr.__ss_padding[0x13] = '\0';
  addr.__ss_padding[0x14] = '\0';
  addr.__ss_padding[0x15] = '\0';
  addr.__ss_padding[0x16] = '\0';
  addr.__ss_padding[0x17] = '\0';
  addr.__ss_padding[0x18] = '\0';
  addr.__ss_padding[0x19] = '\0';
  addr.__ss_padding[0x1a] = '\0';
  addr.__ss_padding[0x1b] = '\0';
  addr.__ss_padding[0x1c] = '\0';
  addr.__ss_padding[0x1d] = '\0';
  addr.ss_family = 0;
  addr.__ss_padding[0] = '\0';
  addr.__ss_padding[1] = '\0';
  addr.__ss_padding[2] = '\0';
  addr.__ss_padding[3] = '\0';
  addr.__ss_padding[4] = '\0';
  addr.__ss_padding[5] = '\0';
  addr.__ss_padding[6] = '\0';
  addr.__ss_padding[7] = '\0';
  addr.__ss_padding[8] = '\0';
  addr.__ss_padding[9] = '\0';
  addr.__ss_padding[10] = '\0';
  addr.__ss_padding[0xb] = '\0';
  addr.__ss_padding[0xc] = '\0';
  addr.__ss_padding[0xd] = '\0';
  local_108._8_8_ = 0x80;
  iov.iov_base = *(void **)(in_RSI + 0x10);
  local_108.msg_iov = (iovec *)&iov;
  iov.iov_len = *(size_t *)(in_RSI + 0x18);
  local_108.msg_iovlen = 1;
  local_108.msg_control = *(void **)(in_RSI + 0x28);
  local_108.msg_controllen = *(ulong *)(in_RSI + 0x30);
  do {
    sVar7 = recvmsg(*(int *)(*(long *)(in_RSI + 8) + 8),&local_108,0);
    if (-1 < sVar7) {
      puVar2 = *(undefined8 **)(*(long *)(in_RSI + 8) + 0x20);
      cVar6 = (**(code **)*puVar2)(puVar2,local_108.msg_name,local_108._8_8_ & 0xffffffff);
      if (cVar6 != '\0') {
        *(ssize_t *)(in_RSI + 0x60) = sVar7;
        *(byte *)(in_RSI + 0x68) = (byte)local_108.msg_flags >> 5 & 1;
        uVar3 = *(undefined8 *)(*(long *)(in_RSI + 8) + 0x10);
        uVar4 = *(undefined8 *)(*(long *)(in_RSI + 8) + 0x20);
        if (*(char *)(in_RSI + 0x70) == '\x01') {
          *(undefined1 *)(in_RSI + 0x70) = 0;
          NetworkAddressImpl::~NetworkAddressImpl((NetworkAddressImpl *)(in_RSI + 0x100));
        }
        SocketAddress::SocketAddress
                  ((SocketAddress *)(in_RSI + 0x78),local_108.msg_name,local_108.msg_namelen);
        *(undefined ***)(in_RSI + 0x100) = &PTR_connect_00677b88;
        *(undefined8 *)(in_RSI + 0x108) = uVar3;
        *(undefined8 *)(in_RSI + 0x110) = uVar4;
        *(SocketAddress **)(in_RSI + 0x118) = (SocketAddress *)(in_RSI + 0x78);
        *(undefined8 *)(in_RSI + 0x120) = 1;
        *(undefined8 **)(in_RSI + 0x128) = &NullArrayDisposer::instance;
        f.exception = (Exception *)0x0;
        *(undefined4 *)(in_RSI + 0x130) = 0;
        Array<kj::(anonymous_namespace)::SocketAddress>::~Array
                  ((Array<kj::(anonymous_namespace)::SocketAddress> *)&f);
        *(undefined1 *)(in_RSI + 0x70) = 1;
        Vector<kj::AncillaryMessage>::resize((Vector<kj::AncillaryMessage> *)(in_RSI + 0x40),0);
        *(byte *)(in_RSI + 0x69) = (byte)local_108.msg_flags >> 3 & 1;
        __cmsg = (cmsghdr *)0x0;
        if (0xf < local_108.msg_controllen) {
          __cmsg = (cmsghdr *)local_108.msg_control;
        }
        for (; (__cmsg != (cmsghdr *)0x0 &&
               (0xf < (ulong)((*(long *)(in_RSI + 0x28) + *(long *)(in_RSI + 0x30)) - (long)__cmsg))
               ); __cmsg = __cmsg_nxthdr(&local_108,__cmsg)) {
          f.exception = *(Exception **)&__cmsg->cmsg_level;
          Vector<kj::AncillaryMessage>::add<kj::AncillaryMessage>
                    ((Vector<kj::AncillaryMessage> *)(in_RSI + 0x40),(AncillaryMessage *)&f);
        }
        kj::_::ReadyNow::operator_cast_to_Promise((ReadyNow *)this);
        return (PromiseBase)(PromiseBase)this;
      }
      receive(this);
      return (PromiseBase)(PromiseBase)this;
    }
    osErrorNumber = kj::_::Debug::getOsErrorNumber(true);
  } while (osErrorNumber == -1);
  if (osErrorNumber == 0) {
    UnixEventPort::FdObserver::whenBecomesReadable((FdObserver *)local_150);
    continuationTracePtr =
         kj::_::
         SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++:1868:55)>
         ::anon_class_8_1_8991fb9c_for_func::operator();
    NVar1 = (NullableValue<kj::OwnFd>)
            ((SleepHooks *)&((PromiseArenaMember *)local_150)->arena)->_vptr_SleepHooks;
    if (NVar1 == (NullableValue<kj::OwnFd>)0x0 || (ulong)((long)local_150 - (long)NVar1) < 0x28) {
      pvVar8 = operator_new(0x400);
      location_00 = (SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_unix_c__:1868:55)>
                     *)((long)pvVar8 + 0x3d8);
      ctor<kj::_::SimpleTransformPromiseNode<void,kj::(anonymous_namespace)::DatagramPortImpl::ReceiverImpl::receive()::_lambda()_2_>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::DatagramPortImpl::ReceiverImpl::receive()::_lambda()_2_,void*&>
                (location_00,(Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)local_150,&local_128
                 ,&continuationTracePtr);
      *(void **)((long)pvVar8 + 0x3e0) = pvVar8;
    }
    else {
      ((SleepHooks *)&((PromiseArenaMember *)local_150)->arena)->_vptr_SleepHooks =
           (_func_int **)0x0;
      location_00 = (SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_unix_c__:1868:55)>
                     *)((unsigned_long *)((long)local_150 + -0x30) + 1);
      ctor<kj::_::SimpleTransformPromiseNode<void,kj::(anonymous_namespace)::DatagramPortImpl::ReceiverImpl::receive()::_lambda()_2_>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::DatagramPortImpl::ReceiverImpl::receive()::_lambda()_2_,void*&>
                (location_00,(Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)local_150,&local_128
                 ,&continuationTracePtr);
      ((Maybe<kj::OwnFd> *)((long)local_150 + -0x20))->ptr = NVar1;
    }
    f.exception = (Exception *)&DAT_0042a172;
    location.function = &DAT_0042a1d1;
    location.fileName = &DAT_0042a172;
    location.lineNumber = 0x58b;
    location.columnNumber = 0x4c;
    intermediate.ptr = (PromiseNode *)location_00;
    kj::_::maybeChain<void>((OwnPromiseNode *)&local_110,(Promise<void> *)&intermediate,location);
    DVar5._vptr_DatagramReceiver = local_110._vptr_DatagramReceiver;
    local_110._vptr_DatagramReceiver = (_func_int **)0x0;
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_110);
    (this->super_DatagramReceiver)._vptr_DatagramReceiver = DVar5._vptr_DatagramReceiver;
    local_d0.ptr = (PromiseNode *)0x0;
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_d0);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&intermediate);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)local_150);
    return (PromiseBase)(PromiseBase)this;
  }
  kj::_::Debug::Fault::Fault
            (&f,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++"
             ,0x748,osErrorNumber,"n = recvmsg(port.fd, &msg, 0)","");
  kj::_::Debug::Fault::fatal(&f);
}

Assistant:

Promise<void> receive() override {
    struct msghdr msg;
    memset(&msg, 0, sizeof(msg));

    struct sockaddr_storage addr;
    memset(&addr, 0, sizeof(addr));
    msg.msg_name = &addr;
    msg.msg_namelen = sizeof(addr);

    struct iovec iov;
    iov.iov_base = contentBuffer.begin();
    iov.iov_len = contentBuffer.size();
    msg.msg_iov = &iov;
    msg.msg_iovlen = 1;
    msg.msg_control = ancillaryBuffer.begin();
    msg.msg_controllen = ancillaryBuffer.size();

    ssize_t n;
    KJ_NONBLOCKING_SYSCALL(n = recvmsg(port.fd, &msg, 0));

    if (n < 0) {
      // No data available. Wait.
      return port.observer.whenBecomesReadable().then([this]() {
        return receive();
      });
    } else {
      if (!port.filter.shouldAllow(reinterpret_cast<const struct sockaddr*>(msg.msg_name),
                                   msg.msg_namelen)) {
        // Ignore message from disallowed source.
        return receive();
      }

      receivedSize = n;
      contentTruncated = msg.msg_flags & MSG_TRUNC;

      source.emplace(port.lowLevel, port.filter, msg.msg_name, msg.msg_namelen);

      ancillaryList.resize(0);
      ancillaryTruncated = msg.msg_flags & MSG_CTRUNC;

      for (struct cmsghdr* cmsg = CMSG_FIRSTHDR(&msg); cmsg != nullptr;
           cmsg = CMSG_NXTHDR(&msg, cmsg)) {
        // On some platforms (OSX), a cmsghdr's length may cross the end of the ancillary buffer
        // when truncated. On other platforms (Linux) the length in cmsghdr will itself be
        // truncated to fit within the buffer.

#if __APPLE__
// On MacOS, `CMSG_SPACE(0)` triggers a bogus warning.
#pragma GCC diagnostic ignored "-Wnull-pointer-arithmetic"
#endif
        const byte* pos = reinterpret_cast<const byte*>(cmsg);
        size_t available = ancillaryBuffer.end() - pos;
        if (available < CMSG_SPACE(0)) {
          // The buffer ends in the middle of the header. We can't use this message.
          // (On Linux, this never happens, because the message is not included if there isn't
          // space for a header. I'm not sure how other systems behave, though, so let's be safe.)
          break;
        }

        // OK, we know the cmsghdr is valid, at least.

        // Find the start of the message payload.
        const byte* begin = (const byte *)CMSG_DATA(cmsg);

        // Cap the message length to the available space.
        const byte* end = pos + kj::min(available, cmsg->cmsg_len);

        ancillaryList.add(AncillaryMessage(
            cmsg->cmsg_level, cmsg->cmsg_type, arrayPtr(begin, end)));
      }

      return READY_NOW;
    }
  }